

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O3

void __thiscall
bgui::ImageAdapter<float>::copyInto(ImageAdapter<float> *this,ImageU8 *rgb,long x,long y)

{
  int iVar1;
  uint uVar2;
  mapping mVar3;
  float ***pppfVar4;
  ulong uVar5;
  Image<float,_gimage::PixelTraits<float>_> *pIVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  uint ig;
  undefined4 uVar13;
  undefined4 uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  double b;
  double g;
  double r;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  uint local_8c;
  double local_88;
  double local_80;
  double local_78;
  uint local_6c;
  double local_68;
  double local_60;
  double local_58;
  long local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_68 = 1.0;
  local_80 = 1.0 / (this->super_ImageAdapterBase).scale;
  local_88 = (this->super_ImageAdapterBase).imax - (this->super_ImageAdapterBase).imin;
  pIVar6 = this->image;
  lVar10 = pIVar6->width;
  lVar8 = pIVar6->height;
  local_50 = y;
  if (0.0 < local_88) {
    dVar15 = log(local_88);
    dVar15 = floor(dVar15 / 2.302585092994046);
    local_68 = pow(10.0,dVar15 + -1.0);
    pIVar6 = this->image;
  }
  if (((this->super_ImageAdapterBase).rotation & 1) != 0) {
    lVar8 = pIVar6->width;
    lVar10 = pIVar6->height;
  }
  iVar1 = pIVar6->depth;
  uVar2 = (this->super_ImageAdapterBase).channel;
  ig = (uint)(2 < iVar1);
  local_6c = (uint)(2 < iVar1) * 2;
  if (-1 < (int)uVar2 && (int)uVar2 < iVar1) {
    ig = uVar2;
    local_6c = uVar2;
  }
  local_8c = 0;
  if (-1 < (int)uVar2 && (int)uVar2 < iVar1) {
    local_8c = uVar2;
  }
  if (0 < rgb->height) {
    local_58 = (double)lVar8;
    local_60 = (double)x;
    local_a8 = (double)lVar10;
    lVar10 = 0;
    dVar15 = local_80;
    do {
      local_a0 = (this->super_ImageAdapterBase).scale;
      local_78 = (double)(local_50 + lVar10) / local_a0;
      uVar11 = 0;
      if ((0.0 <= local_78) && (uVar11 = 0, local_78 < local_58)) {
        local_a0 = local_60 / local_a0;
        uVar11 = 0;
        if (local_a0 < 0.0) {
          uVar11 = 0;
          do {
            if (rgb->width <= (long)uVar11) break;
            (*rgb->img)[lVar10][uVar11] = '\0';
            rgb->img[1][lVar10][uVar11] = '\0';
            rgb->img[2][lVar10][uVar11] = '\0';
            local_a0 = local_a0 + dVar15;
            uVar11 = uVar11 + 1;
          } while (local_a0 < 0.0);
        }
        if ((ig == local_8c) && (mVar3 = (this->super_ImageAdapterBase).map, mVar3 != map_raw)) {
          if (mVar3 == map_jet) {
            if (local_a0 < local_a8) {
              uVar11 = uVar11 & 0xffffffff;
              do {
                if (rgb->width <= (long)uVar11) break;
                dVar16 = (double)(this->super_ImageAdapterBase).R.v[0][2] +
                         (double)(this->super_ImageAdapterBase).R.v[0][0] * local_a0 +
                         (double)(this->super_ImageAdapterBase).R.v[0][1] * local_78;
                dVar17 = (double)(this->super_ImageAdapterBase).R.v[1][2] +
                         (double)(this->super_ImageAdapterBase).R.v[1][0] * local_a0 +
                         (double)(this->super_ImageAdapterBase).R.v[1][1] * local_78;
                dVar15 = getPixel(this,(float)dVar16,(float)dVar17,ig);
                uVar7 = (ulong)this->image->depth;
                if ((long)uVar7 < 1) {
LAB_00113b7c:
                  dVar16 = (this->super_ImageAdapterBase).imin;
                  dVar17 = -0.05;
                  if ((dVar16 <= dVar15) &&
                     (dVar17 = 1.05, dVar15 <= (this->super_ImageAdapterBase).imax)) {
                    dVar17 = (dVar15 - dVar16) / local_88;
                    dVar15 = (this->super_ImageAdapterBase).gamma;
                    if ((dVar15 != 1.0) || (NAN(dVar15))) {
                      if ((int)(dVar15 + 0.5) == 2) {
                        if (dVar17 < 0.0) {
                          dVar17 = sqrt(dVar17);
                        }
                        else {
                          dVar17 = SQRT(dVar17);
                        }
                      }
                      else if (2 < (int)(dVar15 + 0.5)) {
                        dVar17 = 0.0;
                      }
                    }
                  }
                  dVar15 = dVar17 / 1.15 + 0.1;
                  auVar18._0_8_ = ABS(dVar15 + -0.75) * -4.0 + 1.5;
                  auVar18._8_8_ = ABS(dVar15 + -0.5) * -4.0 + 1.5;
                  auVar18 = minpd(auVar18,_DAT_0011b100);
                  auVar18 = maxpd(auVar18,_DAT_0011b120);
                  dVar16 = ABS(dVar15 + -0.25) * -4.0 + 1.5;
                  if (1.0 <= dVar16) {
                    dVar16 = 1.0;
                  }
                  if (dVar16 <= 0.0) {
                    dVar16 = 0.0;
                  }
                }
                else {
                  lVar8 = (long)dVar16;
                  lVar9 = (long)dVar17;
                  pppfVar4 = this->image->img;
                  auVar18 = ZEXT816(0);
                  dVar16 = 0.0;
                  if ((uint)ABS((*pppfVar4)[lVar9][lVar8]) < 0x7f800000) {
                    uVar5 = 1;
                    do {
                      uVar12 = uVar5;
                      if (uVar7 == uVar12) break;
                      uVar5 = uVar12 + 1;
                    } while ((uint)ABS(pppfVar4[uVar12][lVar9][lVar8]) < 0x7f800000);
                    dVar16 = 0.0;
                    if (uVar7 <= uVar12) goto LAB_00113b7c;
                  }
                }
                (*rgb->img)[lVar10][uVar11] = (uchar)(int)(auVar18._0_8_ * 255.0 + 0.5);
                rgb->img[1][lVar10][uVar11] = (uchar)(int)(auVar18._8_8_ * 255.0 + 0.5);
                rgb->img[2][lVar10][uVar11] = (uchar)(int)(dVar16 * 255.0 + 0.5);
                local_a0 = local_a0 + local_80;
                uVar11 = uVar11 + 1;
                dVar15 = local_80;
              } while (local_a0 < local_a8);
            }
          }
          else if ((mVar3 == map_rainbow) && (local_a0 < local_a8)) {
            uVar11 = uVar11 & 0xffffffff;
            do {
              if (rgb->width <= (long)uVar11) break;
              dVar16 = (double)(this->super_ImageAdapterBase).R.v[0][2] +
                       (double)(this->super_ImageAdapterBase).R.v[0][0] * local_a0 +
                       (double)(this->super_ImageAdapterBase).R.v[0][1] * local_78;
              dVar17 = (double)(this->super_ImageAdapterBase).R.v[1][2] +
                       (double)(this->super_ImageAdapterBase).R.v[1][0] * local_a0 +
                       (double)(this->super_ImageAdapterBase).R.v[1][1] * local_78;
              dVar15 = getPixel(this,(float)dVar16,(float)dVar17,ig);
              uVar7 = (ulong)this->image->depth;
              if ((long)uVar7 < 1) {
LAB_001135bf:
                dVar20 = (this->super_ImageAdapterBase).imin;
                dVar19 = (this->super_ImageAdapterBase).imax;
                dVar16 = dVar20;
                if (dVar20 <= dVar15) {
                  dVar16 = dVar15;
                }
                if (dVar16 <= dVar19) {
                  dVar19 = dVar16;
                }
                local_48 = dVar19 / local_68;
                uStack_40 = 0;
                dVar15 = floor(local_48);
                dVar16 = (local_48 - dVar15) * 6.0;
                dVar17 = dVar16 - (double)(int)dVar16;
                dVar15 = 0.0;
                switch((int)dVar16) {
                case 0:
                  dVar16 = 1.0;
                  break;
                case 1:
                  dVar16 = 1.0 - dVar17;
                  dVar15 = 0.0;
                  dVar17 = 1.0;
                  break;
                case 2:
                  dVar16 = 0.0;
                  dVar15 = dVar17;
                  dVar17 = 1.0;
                  break;
                case 3:
                  dVar16 = 0.0;
                  dVar15 = 1.0;
                  dVar17 = 1.0 - dVar17;
                  break;
                case 4:
                  dVar16 = dVar17;
                  dVar15 = 1.0;
                  dVar17 = 0.0;
                  break;
                default:
                  dVar16 = 1.0;
                  dVar15 = 1.0 - dVar17;
                  dVar17 = 0.0;
                }
                dVar20 = ((dVar19 - dVar20) * 1.6) / local_88 + -0.8;
                if (0.0 <= dVar20) {
                  dVar19 = 1.0 - dVar20;
                  dVar16 = dVar16 * dVar19 + dVar20;
                  dVar17 = dVar17 * dVar19 + dVar20;
                  dVar20 = dVar20 + dVar19 * dVar15;
                }
                else {
                  dVar20 = dVar20 + 1.0;
                  dVar16 = dVar16 * dVar20;
                  dVar17 = dVar17 * dVar20;
                  dVar20 = dVar20 * dVar15;
                }
              }
              else {
                lVar8 = (long)dVar16;
                lVar9 = (long)dVar17;
                pppfVar4 = this->image->img;
                dVar16 = 0.0;
                if ((uint)ABS((*pppfVar4)[lVar9][lVar8]) < 0x7f800000) {
                  uVar5 = 1;
                  do {
                    uVar12 = uVar5;
                    if (uVar7 == uVar12) break;
                    uVar5 = uVar12 + 1;
                  } while ((uint)ABS(pppfVar4[uVar12][lVar9][lVar8]) < 0x7f800000);
                  dVar17 = 0.0;
                  dVar20 = 0.0;
                  if (uVar7 <= uVar12) goto LAB_001135bf;
                }
                else {
                  dVar17 = 0.0;
                  dVar20 = 0.0;
                }
              }
              (*rgb->img)[lVar10][uVar11] = (uchar)(int)(dVar16 * 255.0 + 0.5);
              rgb->img[1][lVar10][uVar11] = (uchar)(int)(dVar17 * 255.0 + 0.5);
              rgb->img[2][lVar10][uVar11] = (uchar)(int)(dVar20 * 255.0 + 0.5);
              local_a0 = local_a0 + local_80;
              uVar11 = uVar11 + 1;
              dVar15 = local_80;
            } while (local_a0 < local_a8);
          }
        }
        else if (local_a0 < local_a8) {
          uVar11 = uVar11 & 0xffffffff;
          do {
            if (rgb->width <= (long)uVar11) break;
            getPixel(this,&local_98,&local_b0,&local_b8,
                     (float)((double)(this->super_ImageAdapterBase).R.v[0][2] +
                            (double)(this->super_ImageAdapterBase).R.v[0][0] * local_a0 +
                            (double)(this->super_ImageAdapterBase).R.v[0][1] * local_78),
                     (float)((double)(this->super_ImageAdapterBase).R.v[1][2] +
                            (double)(this->super_ImageAdapterBase).R.v[1][0] * local_a0 +
                            (double)(this->super_ImageAdapterBase).R.v[1][1] * local_78),local_8c,ig
                     ,local_6c);
            uVar13 = SUB84(local_98,0);
            uVar14 = (undefined4)((ulong)local_98 >> 0x20);
            dVar15 = (this->super_ImageAdapterBase).imin;
            dVar16 = (this->super_ImageAdapterBase).imax;
            if (dVar16 <= local_98) {
              uVar13 = SUB84(dVar16,0);
              uVar14 = (undefined4)((ulong)dVar16 >> 0x20);
            }
            if ((double)CONCAT44(uVar14,uVar13) <= dVar15) {
              uVar13 = SUB84(dVar15,0);
              uVar14 = (undefined4)((ulong)dVar15 >> 0x20);
            }
            local_98 = ((double)CONCAT44(uVar14,uVar13) - dVar15) / local_88;
            if (dVar16 <= local_b0) {
              local_b0 = dVar16;
            }
            if (local_b0 <= dVar15) {
              local_b0 = dVar15;
            }
            local_b0 = (local_b0 - dVar15) / local_88;
            if (dVar16 <= local_b8) {
              local_b8 = dVar16;
            }
            if (local_b8 <= dVar15) {
              local_b8 = dVar15;
            }
            local_b8 = (local_b8 - dVar15) / local_88;
            dVar15 = (this->super_ImageAdapterBase).gamma;
            if ((dVar15 != 1.0) || (NAN(dVar15))) {
              if ((int)(dVar15 + 0.5) == 2) {
                if (local_98 < 0.0) {
                  local_98 = sqrt(local_98);
                }
                else {
                  local_98 = SQRT(local_98);
                }
                if (local_b0 < 0.0) {
                  local_b0 = sqrt(local_b0);
                  dVar15 = local_b8;
                }
                else {
                  local_b0 = SQRT(local_b0);
                  dVar15 = local_b8;
                }
              }
              else {
                if ((int)(dVar15 + 0.5) < 3) goto LAB_0011394a;
                if (local_98 < 0.0) {
                  dVar15 = sqrt(local_98);
                }
                else {
                  dVar15 = SQRT(local_98);
                }
                if (dVar15 < 0.0) {
                  local_98 = sqrt(dVar15);
                }
                else {
                  local_98 = SQRT(dVar15);
                }
                if (local_b0 < 0.0) {
                  dVar15 = sqrt(local_b0);
                }
                else {
                  dVar15 = SQRT(local_b0);
                }
                if (dVar15 < 0.0) {
                  local_b0 = sqrt(dVar15);
                }
                else {
                  local_b0 = SQRT(dVar15);
                }
                if (local_b8 < 0.0) {
                  dVar15 = sqrt(local_b8);
                }
                else {
                  dVar15 = SQRT(local_b8);
                }
              }
              if (dVar15 < 0.0) {
                local_b8 = sqrt(dVar15);
              }
              else {
                local_b8 = SQRT(dVar15);
              }
            }
LAB_0011394a:
            (*rgb->img)[lVar10][uVar11] = (uchar)(int)(local_98 * 255.0 + 0.5);
            rgb->img[1][lVar10][uVar11] = (uchar)(int)(local_b0 * 255.0 + 0.5);
            rgb->img[2][lVar10][uVar11] = (uchar)(int)(local_b8 * 255.0 + 0.5);
            local_a0 = local_a0 + local_80;
            uVar11 = uVar11 + 1;
            dVar15 = local_80;
          } while (local_a0 < local_a8);
        }
      }
      for (lVar8 = (long)(int)uVar11; lVar8 < rgb->width; lVar8 = lVar8 + 1) {
        (*rgb->img)[lVar10][lVar8] = '\0';
        rgb->img[1][lVar10][lVar8] = '\0';
        rgb->img[2][lVar10][lVar8] = '\0';
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < rgb->height);
  }
  return;
}

Assistant:

void copyInto(gimage::ImageU8 &rgb, long x, long y) const
    {
      const double step=1/scale;
      const double irange=imax-imin;
      int ir=0, ig=1, ib=2;
      long iw=image->getWidth();
      long ih=image->getHeight();
      double rainbow_size=1;

      if (irange > 0)
      {
        rainbow_size=std::pow(10, std::floor(std::log(irange)/std::log(10))-1);
      }

      if ((rotation&1) != 0)
      {
        iw=image->getHeight();
        ih=image->getWidth();
      }

      assert(rgb.getDepth() == 3);

      if (image->getDepth() < 3)
      {
        ir=ig=ib=0;
      }

      if (channel >= 0 && channel < image->getDepth())
      {
        ir=ig=ib=channel;
      }

      for (int k=0; k<rgb.getHeight(); k++)
      {
        double yf=(y+k)/scale;

        int i=0;

        if (yf >= 0 && yf < ih)
        {
          double xf=x/scale;

          while (xf < 0 && i < rgb.getWidth())
          {
            rgb.set(i, k, 0, 0);
            rgb.set(i, k, 1, 0);
            rgb.set(i, k, 2, 0);

            xf+=step;
            i++;
          }

          if (ig != ir || map == map_raw)
          {
            // map color image or greyscale image directly

            while (xf < iw && i < rgb.getWidth())
            {
              float xs=static_cast<float>(R(0, 0)*xf+R(0, 1)*yf+R(0, 2));
              float ys=static_cast<float>(R(1, 0)*xf+R(1, 1)*yf+R(1, 2));

              double r, g, b;
              getPixel(r, g, b, xs, ys, ir, ig, ib);

              r=(std::max(imin, std::min(imax, r))-imin)/irange;
              g=(std::max(imin, std::min(imax, g))-imin)/irange;
              b=(std::max(imin, std::min(imax, b))-imin)/irange;

              if (gamma != 1.0)
              {
                // pow() can be extremly slow and linear lookup tables would be
                // very big for data with higher radiometric depth, thats why we
                // only allow a gamma with root of 2 and 4.

                if (static_cast<int>(gamma+0.5) == 2)
                {
                  r=sqrt(r);
                  g=sqrt(g);
                  b=sqrt(b);
                }
                else if (static_cast<int>(gamma+0.5) >= 3)
                {
                  r=sqrt(sqrt(r));
                  g=sqrt(sqrt(g));
                  b=sqrt(sqrt(b));
                }
              }

              rgb.set(i, k, 0, static_cast<char>(255*r+0.5));
              rgb.set(i, k, 1, static_cast<char>(255*g+0.5));
              rgb.set(i, k, 2, static_cast<char>(255*b+0.5));

              xf+=step;
              i++;
            }
          }
          else if (map == map_jet)
          {
            // map greyscale image using jet encoding

            while (xf < iw && i < rgb.getWidth())
            {
              float xs=static_cast<float>(R(0, 0)*xf+R(0, 1)*yf+R(0, 2));
              float ys=static_cast<float>(R(1, 0)*xf+R(1, 1)*yf+R(1, 2));

              double v=getPixel(xs, ys, ir);
              double r=0.0;
              double g=0.0;
              double b=0.0;

              if (image->isValid(static_cast<long>(xs), static_cast<long>(ys)))
              {
                if (v >= imin)
                {
                  if (v <= imax)
                  {
                    v=(v-imin)/irange;

                    if (gamma != 1.0)
                    {
                      // pow() can be extremly slow and linear lookup tables would be
                      // very big for data with higher radiometric depth, thats why we
                      // only allow a gamma with root of 2 and 4.

                      if (static_cast<int>(gamma+0.5) == 2)
                      {
                        v=sqrt(v);
                      }
                      else if (static_cast<int>(gamma+0.5) >= 3)
                      {
                        v=sqrt(sqrt(r));
                      }
                    }
                  }
                  else
                  {
                    v=1.05;
                  }
                }
                else
                {
                  v=-0.05;
                }

                v=v/1.15+0.1;
                r=std::max(0.0, std::min(1.0, (1.5 - 4*fabs(v-0.75))));
                g=std::max(0.0, std::min(1.0, (1.5 - 4*fabs(v-0.5))));
                b=std::max(0.0, std::min(1.0, (1.5 - 4*fabs(v-0.25))));
              }

              rgb.set(i, k, 0, static_cast<char>(255*r+0.5));
              rgb.set(i, k, 1, static_cast<char>(255*g+0.5));
              rgb.set(i, k, 2, static_cast<char>(255*b+0.5));

              xf+=step;
              i++;
            }
          }
          else if (map == map_rainbow)
          {
            while (xf < iw && i < rgb.getWidth())
            {
              float xs=static_cast<float>(R(0, 0)*xf+R(0, 1)*yf+R(0, 2));
              float ys=static_cast<float>(R(1, 0)*xf+R(1, 1)*yf+R(1, 2));

              double v=getPixel(xs, ys, ir);
              double r=0.0;
              double g=0.0;
              double b=0.0;

              if (image->isValid(static_cast<long>(xs), static_cast<long>(ys)))
              {
                if (v < imin)
                {
                  v=imin;
                }

                if (v > imax)
                {
                  v=imax;
                }

                // compute color

                double v1=v/rainbow_size;

                v1=6.0*(v1-floor(v1));

                int v0=static_cast<int>(v1);

                v1-=v0;

                switch (v0)
                {
                  case 0:
                    r=1.0;
                    g=v1;
                    break;

                  case 1:
                    r=1.0-v1;
                    g=1.0;
                    break;

                  case 2:
                    g=1.0;
                    b=v1;
                    break;

                  case 3:
                    g=1.0-v1;
                    b=1.0;
                    break;

                  case 4:
                    b=1.0;
                    r=v1;
                    break;

                  default:
                    b=1.0-v1;
                    r=1.0;
                    break;
                }

                // compute brightness

                v=1.6*(v-imin)/irange-0.8;

                if (v < 0)
                {
                  r*=v+1;
                  g*=v+1;
                  b*=v+1;
                }
                else
                {
                  r=(1-v)*r+v;
                  g=(1-v)*g+v;
                  b=(1-v)*b+v;
                }
              }

              rgb.set(i, k, 0, static_cast<int>(255*r+0.5));
              rgb.set(i, k, 1, static_cast<int>(255*g+0.5));
              rgb.set(i, k, 2, static_cast<int>(255*b+0.5));

              xf+=step;
              i++;
            }
          }
        }

        while (i < rgb.getWidth())
        {
          rgb.set(i, k, 0, 0);
          rgb.set(i, k, 1, 0);
          rgb.set(i, k, 2, 0);

          i++;
        }
      }
    }